

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O1

HT_EventKlassId __thiscall
HawkTracer::parser::KlassRegister::get_klass_id(KlassRegister *this,string *name)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  HT_EventKlassId HVar3;
  __node_base *p_Var4;
  bool bVar5;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  p_Var4 = &(this->_register)._M_h._M_before_begin;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      HVar3 = 0xffffffff;
      goto LAB_0010f075;
    }
    p_Var1 = (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor)[8].
             _M_nxt;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,p_Var1,
               (long)&p_Var1->_M_nxt +
               (long)&((*(_Hash_node_base **)
                         &((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor)[9]._M_nxt)->
                      _M_nxt);
    if (local_48 == name->_M_string_length) {
      if (local_48 == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(local_50,(name->_M_dataplus)._M_p,local_48);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  } while (!bVar5);
  HVar3 = *(HT_EventKlassId *)
           &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor)[0xc].
            _M_nxt;
LAB_0010f075:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return HVar3;
}

Assistant:

HT_EventKlassId KlassRegister::get_klass_id(const std::string& name) const
{
    lock_guard l(_register_mtx);
    for (const auto& klass : _register)
    {
        if (klass.second->get_name() == name)
        {
            return klass.second->get_id();
        }
    }

    return HT_INVALID_KLASS_ID;
}